

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int gmatch(lua_State *L)

{
  char *s_00;
  char *p_00;
  undefined8 *puVar1;
  GMatchState *gm;
  char *p;
  char *s;
  size_t lp;
  size_t ls;
  lua_State *L_local;
  
  ls = (size_t)L;
  s_00 = luaL_checklstring(L,1,&lp);
  p_00 = luaL_checklstring((lua_State *)ls,2,(size_t *)&s);
  lua_settop((lua_State *)ls,2);
  puVar1 = (undefined8 *)lua_newuserdata((lua_State *)ls,0x240);
  prepstate((MatchState *)(puVar1 + 3),(lua_State *)ls,s_00,lp,p_00,(size_t)s);
  *puVar1 = s_00;
  puVar1[1] = p_00;
  puVar1[2] = 0;
  lua_pushcclosure((lua_State *)ls,gmatch_aux,3);
  return 1;
}

Assistant:

static int gmatch (lua_State *L) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  GMatchState *gm;
  lua_settop(L, 2);  /* keep them on closure to avoid being collected */
  gm = (GMatchState *)lua_newuserdata(L, sizeof(GMatchState));
  prepstate(&gm->ms, L, s, ls, p, lp);
  gm->src = s; gm->p = p; gm->lastmatch = NULL;
  lua_pushcclosure(L, gmatch_aux, 3);
  return 1;
}